

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

any * __thiscall linb::any::operator=(any *this,float *value)

{
  storage_union local_28;
  undefined1 *local_18;
  
  local_18 = vtable_for_type<float>()::table;
  local_28._0_4_ = *value;
  swap((any *)&local_28,this);
  if (local_18 != (undefined1 *)0x0) {
    (**(code **)(local_18 + 8))(&local_28);
  }
  return this;
}

Assistant:

any& operator=(ValueType&& value)
    {
        static_assert(std::is_copy_constructible<typename std::decay<ValueType>::type>::value,
            "T shall satisfy the CopyConstructible requirements.");
        any(std::forward<ValueType>(value)).swap(*this);
        return *this;
    }